

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper::RunImpl
          (TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_100 [2];
  TestDetails local_c0;
  int local_9c;
  RunTestIfNameIs local_98;
  undefined1 local_90 [8];
  Test should_not_run;
  undefined1 local_48 [8];
  Test should_run;
  TestRunnerFixtureTestRunnerRunsTestsThatPassPredicateHelper *this_local;
  
  should_run._48_8_ = this;
  UnitTest::Test::Test((Test *)local_48,"goodtest","DefaultSuite","",0);
  UnitTest::TestList::Add(&(this->super_TestRunnerFixture).list,(Test *)local_48);
  UnitTest::Test::Test((Test *)local_90,"badtest","DefaultSuite","",0);
  UnitTest::TestList::Add(&(this->super_TestRunnerFixture).list,(Test *)local_90);
  RunTestIfNameIs::RunTestIfNameIs(&local_98,"goodtest");
  UnitTest::TestRunner::RunTestsIf<(anonymous_namespace)::RunTestIfNameIs>
            (&(this->super_TestRunnerFixture).runner,&(this->super_TestRunnerFixture).list,
             (char *)0x0,&local_98,0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_9c = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_c0,*ppTVar3,0x11f);
  UnitTest::CheckEqual<int,int>
            (pTVar1,&local_9c,&(this->super_TestRunnerFixture).reporter.testRunCount,&local_c0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(local_100,*ppTVar3,0x120);
  UnitTest::CheckEqual
            (pTVar1,"goodtest",(this->super_TestRunnerFixture).reporter.lastStartedTest,local_100);
  UnitTest::Test::~Test((Test *)local_90);
  UnitTest::Test::~Test((Test *)local_48);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, TestRunnerRunsTestsThatPassPredicate)
{
    Test should_run("goodtest");
    list.Add(&should_run);

    Test should_not_run("badtest");
	list.Add(&should_not_run);
 
	runner.RunTestsIf(list, NULL, RunTestIfNameIs("goodtest"), 0);
	CHECK_EQUAL(1, reporter.testRunCount);
    CHECK_EQUAL("goodtest", reporter.lastStartedTest);
}